

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O3

DisplayItem *
pbrt::GetImageDisplayItem
          (DisplayItem *__return_storage_ptr__,string *title,Image *image,
          optional<pbrt::ImageChannelDesc> *channelDesc)

{
  Tuple2<pbrt::Point2,_int> resolution;
  undefined1 auVar1 [16];
  pointer pbVar2;
  int iVar3;
  optional<pbrt::ImageChannelDesc> *this;
  DisplayItem *extraout_RAX;
  DisplayItem *pDVar4;
  long *plVar5;
  long lVar6;
  string ret;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  _Any_data local_248;
  code *pcStack_238;
  code *pcStack_230;
  undefined1 local_228 [8];
  pointer pbStack_220;
  pointer local_218;
  DisplayItem *local_208;
  string *local_200;
  undefined1 local_1f8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  undefined1 local_1c8 [16];
  long *local_1b8 [2];
  long local_1a8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  aligned_storage_t<sizeof(pbrt::ImageChannelDesc),_alignof(pbrt::ImageChannelDesc)> local_180;
  char local_150;
  Image local_148;
  
  pstd::optional<pbrt::ImageChannelDesc>::optional
            ((optional<pbrt::ImageChannelDesc> *)&local_180.__align,channelDesc);
  Image::Image(&local_148,image);
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (channelDesc->set == true) {
    Image::ChannelNames_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_228,image,(ImageChannelDesc *)channelDesc);
    pbVar2 = local_218;
    local_1f8._16_8_ =
         local_268.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1f8._8_8_ =
         local_268.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_1f8._0_8_ =
         local_268.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_218 = (pointer)0x0;
    local_268.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar2;
    local_268.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_228;
    local_268.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbStack_220;
    _local_228 = ZEXT816(0) << 0x20;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_228);
  }
  else {
    iVar3 = (int)(image->channelNames).nStored;
    if (iVar3 == 3) {
      local_1f8._0_8_ = local_1f8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"R","");
      local_1d8._M_allocated_capacity = (size_type)local_1c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"G","");
      plVar5 = local_1a8;
      local_1b8[0] = plVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"B","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_268,
                 local_1f8,&local_198);
      lVar6 = -0x60;
      do {
        if (plVar5 != (long *)plVar5[-2]) {
          operator_delete((long *)plVar5[-2],*plVar5 + 1);
        }
        plVar5 = plVar5 + -4;
        lVar6 = lVar6 + 0x20;
      } while (lVar6 != 0);
    }
    else {
      auVar1._12_4_ = 0;
      auVar1._0_12_ = stack0xfffffffffffffddc;
      _local_228 = auVar1 << 0x20;
      local_208 = __return_storage_ptr__;
      local_200 = title;
      if (0 < iVar3) {
        do {
          local_1f8._8_8_ = (pointer)0x0;
          local_1f8._16_8_ = local_1f8._16_8_ & 0xffffffffffffff00;
          local_1f8._0_8_ = (pointer)(local_1f8 + 0x10);
          detail::stringPrintfRecursive<int&>((string *)local_1f8,"channel %d",(int *)local_228);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_268
                     ,(string *)local_1f8);
          if ((pointer)local_1f8._0_8_ != (pointer)(local_1f8 + 0x10)) {
            operator_delete((void *)local_1f8._0_8_,(ulong)(local_1f8._16_8_ + 1));
          }
          iVar3 = local_228._0_4_ + 1;
          local_228._0_4_ = iVar3;
          title = local_200;
          __return_storage_ptr__ = local_208;
        } while (iVar3 < (int)(image->channelNames).nStored);
      }
    }
  }
  resolution = (image->resolution).super_Tuple2<pbrt::Point2,_int>;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_198,&local_268);
  local_248._M_unused._M_object = (void *)0x0;
  local_248._8_8_ = 0;
  pcStack_238 = (code *)0x0;
  pcStack_230 = (code *)0x0;
  this = (optional<pbrt::ImageChannelDesc> *)operator_new(0x150);
  pstd::optional<pbrt::ImageChannelDesc>::optional
            (this,(optional<pbrt::ImageChannelDesc> *)&local_180.__align);
  Image::Image((Image *)(this + 1),&local_148);
  pcStack_230 = std::
                _Function_handler<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/display.cpp:436:22)>
                ::_M_invoke;
  pcStack_238 = std::
                _Function_handler<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/display.cpp:436:22)>
                ::_M_manager;
  local_248._M_unused._M_object = this;
  DisplayItem::DisplayItem
            (__return_storage_ptr__,title,(Point2i)resolution,&local_198,
             (function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *)&local_248);
  if (pcStack_238 != (code *)0x0) {
    (*pcStack_238)(&local_248,&local_248,__destroy_functor);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_198);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_268);
  local_148.p32.nStored = 0;
  (*(local_148.p32.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_148.p32.alloc.memoryResource,local_148.p32.ptr,local_148.p32.nAlloc << 2,4);
  local_148.p16.nStored = 0;
  (*(local_148.p16.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_148.p16.alloc.memoryResource,local_148.p16.ptr,local_148.p16.nAlloc * 2,2);
  local_148.p8.nStored = 0;
  (*(local_148.p8.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_148.p8.alloc.memoryResource,local_148.p8.ptr,local_148.p8.nAlloc,1);
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector(&local_148.channelNames);
  pDVar4 = extraout_RAX;
  if (local_150 == '\x01') {
    local_180._40_8_ = 0;
    pDVar4 = (DisplayItem *)
             (**(code **)(*(long *)local_180.__align + 0x18))
                       (local_180.__align,local_180._8_8_,local_180._32_8_ << 2,4);
  }
  return pDVar4;
}

Assistant:

static DisplayItem GetImageDisplayItem(const std::string &title, const Image &image,
                                       pstd::optional<ImageChannelDesc> channelDesc) {
    auto getValues = [=](Bounds2i b, pstd::span<pstd::span<Float>> displayValues) {
        int offset = 0;
        for (Point2i p : b) {
            ImageChannelValues v =
                channelDesc ? image.GetChannels(p, *channelDesc) : image.GetChannels(p);
            for (int i = 0; i < v.size(); ++i)
                displayValues[i][offset] = v[i];
            ++offset;
        }
    };

    std::vector<std::string> channelNames;
    if (channelDesc)
        channelNames = image.ChannelNames(*channelDesc);
    else {
        if (image.NChannels() == 3)
            channelNames = {"R", "G", "B"};
        else
            for (int i = 0; i < image.NChannels(); ++i)
                channelNames.push_back(StringPrintf("channel %d", i));
    }

    return DisplayItem(title, image.Resolution(), channelNames, getValues);
}